

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

void CECoordinates::ICRS2CIRS
               (double input_ra,double input_dec,double *return_ra,double *return_dec,CEDate *date,
               CEAngleType *angle_type)

{
  int *in_RCX;
  long *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  exception *e;
  double tdb2;
  double tdb1;
  double eo;
  double *in_stack_fffffffffffffef8;
  double *in_stack_ffffffffffffff00;
  undefined1 local_38 [8];
  int *local_30;
  double *local_20;
  double *local_18;
  double local_10;
  double local_8;
  
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  if (*in_RCX == 0) {
    local_8 = in_XMM0_Qa * 0.017453292519943295;
    local_10 = in_XMM1_Qa * 0.017453292519943295;
  }
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  (**(code **)(*in_RDX + 0x28))();
  CEDate::UTC2TDB(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(double *)0x12f957);
  iauAtci13(local_8,local_10,0,0,0,0,0,0,local_18,local_20,local_38);
  if (*local_30 == 0) {
    *local_18 = *local_18 * 57.29577951308232;
    *local_20 = *local_20 * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::ICRS2CIRS(double input_ra, double input_dec,
                              double *return_ra, double *return_dec,
                              const CEDate& date, const CEAngleType& angle_type)
{
    // Convert to radians if necessary
    if (angle_type==CEAngleType::DEGREES) {
        input_ra  *= DD2R ;
        input_dec *= DD2R ;
    }
    
    // Store the equation of the origins
    double eo ; // Equation of the origins
    
    // Use the sofa library to convert these coordinates
    try {
        double tdb1(0.0);
        double tdb2(0.0);
        CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);
        iauAtci13(input_ra, input_dec, 
                  0.0, 0.0, 0.0, 0.0, 
                  tdb1, tdb2, 
                  return_ra, return_dec, &eo) ;
        
        // Subtract the equation of the origins if J2000 coordinates are desired
        //*return_ra -= eo ;
    } catch (std::exception &e) {
        throw CEException::sofa_exception("CECoordinates::ICRS2CIRS",
                                          "iauAtci13", 
                                          "Exception thrown");
    }
    
    // Convert the returned coordinates to the correct angle type
    if (angle_type == CEAngleType::DEGREES) {
        *return_ra *= DR2D ;
        *return_dec *= DR2D ;
    }
    
    return ;
}